

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cifras.cc
# Opt level: O0

int main(int argc,char **argv)

{
  size_t this;
  long lVar1;
  bool bVar2;
  ostream *poVar3;
  size_t sVar4;
  reference pvVar5;
  iterator iVar6;
  iterator iVar7;
  Node *pNVar8;
  clock_t cVar9;
  long lVar10;
  size_type sVar11;
  void *this_00;
  code *__ptr;
  double cps;
  double clocks;
  clock_t after;
  _List_node_base *p_Stack_120;
  size_t local_118;
  Node *local_110;
  Node *root;
  clock_t before;
  set<std::__cxx11::list<long,_std::allocator<long>_>,_std::less<std::__cxx11::list<long,_std::allocator<long>_>_>,_std::allocator<std::__cxx11::list<long,_std::allocator<long>_>_>_>
  explored_nodes;
  MemoryManager *mm;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_c0;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_b8;
  undefined1 local_b0 [8];
  list<long,_std::allocator<long>_> basics;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_80;
  long *local_78;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_70;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_68;
  value_type local_60;
  long target;
  undefined4 local_50;
  int ii;
  long local_40;
  long number;
  char *endptr;
  vector<long,_std::allocator<long>_> basics_v;
  char **argv_local;
  int argc_local;
  
  basics_v.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)argv;
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)&endptr);
  if (argc < 4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar3 = std::operator<<(poVar3,(char *)*basics_v.
                                             super__Vector_base<long,_std::allocator<long>_>._M_impl
                                             .super__Vector_impl_data._M_end_of_storage);
    poVar3 = std::operator<<(poVar3," num num... target");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = -1;
    local_50 = 1;
  }
  else {
    for (target._4_4_ = 1; target._4_4_ < argc; target._4_4_ = target._4_4_ + 1) {
      local_40 = strtol((char *)basics_v.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage[target._4_4_],
                        (char **)&number,0);
      lVar1 = number;
      lVar10 = basics_v.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage[target._4_4_];
      sVar4 = strlen((char *)basics_v.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage[target._4_4_]);
      if (lVar1 != lVar10 + sVar4) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Error: \"");
        poVar3 = std::operator<<(poVar3,(char *)basics_v.
                                                super__Vector_base<long,_std::allocator<long>_>.
                                                _M_impl.super__Vector_impl_data._M_end_of_storage
                                                [target._4_4_]);
        poVar3 = std::operator<<(poVar3,"\" not a number.");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = -2;
        local_50 = 1;
        goto LAB_0010ea34;
      }
      if (local_40 < 1) {
        poVar3 = std::operator<<((ostream *)&std::cerr,
                                 "Error: numbers below or equal to zero are not allowed.");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = -3;
        local_50 = 1;
        goto LAB_0010ea34;
      }
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)&endptr,&local_40);
    }
    pvVar5 = std::vector<long,_std::allocator<long>_>::back
                       ((vector<long,_std::allocator<long>_> *)&endptr);
    local_60 = *pvVar5;
    std::vector<long,_std::allocator<long>_>::pop_back
              ((vector<long,_std::allocator<long>_> *)&endptr);
    local_70._M_current =
         (long *)std::vector<long,_std::allocator<long>_>::begin
                           ((vector<long,_std::allocator<long>_> *)&endptr);
    local_78 = (long *)std::vector<long,_std::allocator<long>_>::end
                                 ((vector<long,_std::allocator<long>_> *)&endptr);
    local_68 = std::
               find<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
                         (local_70,(__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                                    )local_78,&local_60);
    local_80._M_current =
         (long *)std::vector<long,_std::allocator<long>_>::end
                           ((vector<long,_std::allocator<long>_> *)&endptr);
    bVar2 = __gnu_cxx::operator!=(&local_68,&local_80);
    if (bVar2) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Error: target present in numbers to operate.")
      ;
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = -4;
      local_50 = 1;
    }
    else {
      iVar6 = std::vector<long,_std::allocator<long>_>::begin
                        ((vector<long,_std::allocator<long>_> *)&endptr);
      iVar7 = std::vector<long,_std::allocator<long>_>::end
                        ((vector<long,_std::allocator<long>_> *)&endptr);
      std::
      sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,std::greater<long>>
                (iVar6._M_current,iVar7._M_current);
      local_b8._M_current =
           (long *)std::vector<long,_std::allocator<long>_>::begin
                             ((vector<long,_std::allocator<long>_> *)&endptr);
      local_c0._M_current =
           (long *)std::vector<long,_std::allocator<long>_>::end
                             ((vector<long,_std::allocator<long>_> *)&endptr);
      std::allocator<long>::allocator((allocator<long> *)((long)&mm + 7));
      std::__cxx11::list<long,std::allocator<long>>::
      list<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,void>
                ((list<long,std::allocator<long>> *)local_b0,local_b8,local_c0,
                 (allocator<long> *)((long)&mm + 7));
      std::allocator<long>::~allocator((allocator<long> *)((long)&mm + 7));
      explored_nodes._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)MemoryManager::instance();
      std::
      set<std::__cxx11::list<long,_std::allocator<long>_>,_std::less<std::__cxx11::list<long,_std::allocator<long>_>_>,_std::allocator<std::__cxx11::list<long,_std::allocator<long>_>_>_>
      ::set((set<std::__cxx11::list<long,_std::allocator<long>_>,_std::less<std::__cxx11::list<long,_std::allocator<long>_>_>,_std::allocator<std::__cxx11::list<long,_std::allocator<long>_>_>_>
             *)&before);
      root = (Node *)clock();
      this = explored_nodes._M_t._M_impl.super__Rb_tree_header._M_node_count;
      after = 0;
      p_Stack_120 = (_List_node_base *)0x0;
      local_118 = 0;
      std::__cxx11::list<const_Operation_*,_std::allocator<const_Operation_*>_>::list
                ((list<const_Operation_*,_std::allocator<const_Operation_*>_> *)&after);
      pNVar8 = MemoryManager::build_node
                         ((MemoryManager *)this,
                          (list<const_Operation_*,_std::allocator<const_Operation_*>_> *)&after,0,
                          local_60,(list<long,_std::allocator<long>_> *)local_b0,
                          (set<std::__cxx11::list<long,_std::allocator<long>_>,_std::less<std::__cxx11::list<long,_std::allocator<long>_>_>,_std::allocator<std::__cxx11::list<long,_std::allocator<long>_>_>_>
                           *)&before,(Node *)0x0);
      std::__cxx11::list<const_Operation_*,_std::allocator<const_Operation_*>_>::~list
                ((list<const_Operation_*,_std::allocator<const_Operation_*>_> *)&after);
      local_110 = pNVar8;
      cVar9 = clock();
      pNVar8 = Node::best(local_110);
      operator<<((ostream *)&std::cout,pNVar8);
      lVar10 = cVar9 - (long)root;
      poVar3 = std::operator<<((ostream *)&std::cout,"Elapsed time: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(double)lVar10 / 1000000.0);
      poVar3 = std::operator<<(poVar3," seconds");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"Explored nodes: ");
      sVar11 = std::
               set<std::__cxx11::list<long,_std::allocator<long>_>,_std::less<std::__cxx11::list<long,_std::allocator<long>_>_>,_std::allocator<std::__cxx11::list<long,_std::allocator<long>_>_>_>
               ::size((set<std::__cxx11::list<long,_std::allocator<long>_>,_std::less<std::__cxx11::list<long,_std::allocator<long>_>_>,_std::allocator<std::__cxx11::list<long,_std::allocator<long>_>_>_>
                       *)&before);
      this_00 = (void *)std::ostream::operator<<(poVar3,sVar11);
      __ptr = std::endl<char,std::char_traits<char>>;
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      MemoryManager::free((MemoryManager *)
                          explored_nodes._M_t._M_impl.super__Rb_tree_header._M_node_count,__ptr);
      argv_local._4_4_ = 0;
      local_50 = 1;
      std::
      set<std::__cxx11::list<long,_std::allocator<long>_>,_std::less<std::__cxx11::list<long,_std::allocator<long>_>_>,_std::allocator<std::__cxx11::list<long,_std::allocator<long>_>_>_>
      ::~set((set<std::__cxx11::list<long,_std::allocator<long>_>,_std::less<std::__cxx11::list<long,_std::allocator<long>_>_>,_std::allocator<std::__cxx11::list<long,_std::allocator<long>_>_>_>
              *)&before);
      std::__cxx11::list<long,_std::allocator<long>_>::~list
                ((list<long,_std::allocator<long>_> *)local_b0);
    }
  }
LAB_0010ea34:
  std::vector<long,_std::allocator<long>_>::~vector((vector<long,_std::allocator<long>_> *)&endptr);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
	vector<long> basics_v;
	char *endptr;
	long number;
	
	// Check number of arguments.
	if (argc < 4) {
		cerr << "Usage: " << argv[0] << " num num... target" << endl;
		return -1;
	}

	// Get number list, checking argument format.
	for (int ii = 1; ii < argc; ++ii) {
		number = strtol(argv[ii], &endptr, 0);

		if (endptr != argv[ii] + strlen(argv[ii])) {
			cerr << "Error: \"" << argv[ii] << "\" not a number."
									<< endl;
			return -2;
		}
		
		if (number <= 0) {
			cerr << "Error: numbers below or equal to zero are not "
							     "allowed." << endl;
			return -3;
		}

		basics_v.push_back(number);
	}

	// Separate target.
	long target = basics_v.back();
	basics_v.pop_back();

	// Check target not in numbers.
	if (find(basics_v.begin(), basics_v.end(), target) != basics_v.end()) {
		cerr << "Error: target present in numbers to operate." << endl;
		return -4;
	}

	// Sort initial numbers and change to list.
	sort(basics_v.begin(), basics_v.end(), greater<long>());
	list<long> basics(basics_v.begin(), basics_v.end());

	// Execution.
	MemoryManager *mm = MemoryManager::instance();
	set<list<long> > explored_nodes;
	clock_t before = clock();
	Node *root = mm->build_node(list<const Operation *>(), 0L, target,
				    basics, explored_nodes, 0);
	clock_t after = clock();
	
	// Print results.
	cout << root->best();
	double clocks = static_cast<double>(after - before);
	double cps = static_cast<double>(CLOCKS_PER_SEC);
	cout << "Elapsed time: " << (clocks / cps) << " seconds" << endl;
	cout << "Explored nodes: " << explored_nodes.size() << endl;

	// Free memory.
	mm->free();
		
	return 0;
}